

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall
IR::Instr::ConvertToBailOutInstr
          (Instr *this,BailOutInfo *bailOutInfo,BailOutKind kind,bool useAuxBailOut)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  BailOutKind BVar4;
  BailOutKind BVar5;
  RegSlot reg;
  ProfiledInstr *pPVar6;
  ProfiledInstr *pPVar7;
  BranchInstr *this_00;
  LabelInstr *labelInstr;
  undefined4 *puVar8;
  BranchBailOutInstr *branchBailOutInstr;
  BranchInstr *branchInstr;
  Instr *bailOutInstr;
  bool useAuxBailOut_local;
  BailOutKind kind_local;
  BailOutInfo *bailOutInfo_local;
  Instr *this_local;
  
  bVar3 = HasBailOutInfo(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb5,"(!this->HasBailOutInfo())","!this->HasBailOutInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if ((useAuxBailOut) && (bVar3 = HasAuxBailOut(this), bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb7,"(!useAuxBailOut || !this->HasAuxBailOut())","Already aux bail out!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar3 = HasAuxBailOut(this);
  if ((bVar3) && (BVar4 = GetAuxBailOutKind(this), BVar4 == BailOutInvalid)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb8,
                       "(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid)"
                       ,"!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  branchInstr = (BranchInstr *)0x0;
  bVar3 = HasAuxBailOut(this);
  if (bVar3) {
    BVar4 = GetAuxBailOutKind(this);
    BVar5 = operator|(BailOutIgnoreException,BailOutForceByFlag);
    BVar5 = operator~(BVar5);
    BVar4 = IR::operator&(BVar4,BVar5);
    if (BVar4 != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcc2,
                         "((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0)"
                         ,"Only IR::BailOutIgnoreException|ForceByFlag supported here.");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    SetBailOutKind_NoAssert(this,kind);
    ReplaceBailOutInfo(this,bailOutInfo);
    bailOutInfo->bailOutInstr = this;
    this->field_0x38 = this->field_0x38 & 0xef | 0x10;
    branchInstr = (BranchInstr *)this;
  }
  else {
    IVar1 = this->m_kind;
    if (IVar1 == InstrKindInstr) {
      branchInstr = (BranchInstr *)
                    BailOutInstrTemplate<IR::Instr>::New
                              (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
    }
    else if (IVar1 == InstrKindBranch) {
      this_00 = AsBranchInstr(this);
      bVar3 = BranchInstr::IsMultiBranch(this_00);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xcdf,"(!branchInstr->IsMultiBranch())","!branchInstr->IsMultiBranch()")
        ;
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      branchInstr = &BailOutInstrTemplate<IR::BranchInstr>::New
                               (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc)->
                     super_BranchInstr;
      labelInstr = BranchInstr::GetTarget(this_00);
      BranchInstr::SetTarget(branchInstr,labelInstr);
      reg = BranchInstr::GetByteCodeReg(this_00);
      BranchInstr::SetByteCodeReg(branchInstr,reg);
    }
    else if (IVar1 == InstrKindProfiled) {
      branchInstr = (BranchInstr *)
                    BailOutInstrTemplate<IR::ProfiledInstr>::New
                              (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
      pPVar6 = AsProfiledInstr(this);
      pPVar7 = AsProfiledInstr((Instr *)branchInstr);
      pPVar7->u = pPVar6->u;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xce7,"(false)","false");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    this->m_next->m_prev = &branchInstr->super_Instr;
    this->m_prev->m_next = &branchInstr->super_Instr;
    (branchInstr->super_Instr).m_next = this->m_next;
    (branchInstr->super_Instr).m_prev = this->m_prev;
    TransferTo(this,&branchInstr->super_Instr);
    Free(this);
  }
  if (useAuxBailOut) {
    SetAuxBailOutKind(&branchInstr->super_Instr,kind);
    SetBailOutKind_NoAssert(&branchInstr->super_Instr,BailOutInvalid);
    (branchInstr->super_Instr).field_0x38 = (branchInstr->super_Instr).field_0x38 & 0xef;
    (branchInstr->super_Instr).field_0x38 = (branchInstr->super_Instr).field_0x38 & 0xbf | 0x40;
  }
  return &branchInstr->super_Instr;
}

Assistant:

IR::Instr *
Instr::ConvertToBailOutInstr(BailOutInfo * bailOutInfo, IR::BailOutKind kind, bool useAuxBailOut /* = false */)
{
    Assert(!this->HasBailOutInfo());

    AssertMsg(!useAuxBailOut || !this->HasAuxBailOut(), "Already aux bail out!");
    Assert(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid);

    IR::Instr * bailOutInstr = nullptr;
    if (this->HasAuxBailOut())
    {
        // This instr has already been converted to bailout instr. Only possible with aux bail out.
        // Typical scenario is when globopt calls to convert to e.g. BailOutOnImplicitCalls for the instr which
        // was already converted to bail out instr with HasBailOutInfo() == false and HasAuxBailOutInfo() == true,
        // so that aux bail out is hidden in between IRBuilder and lowerer.

        AssertMsg((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0, "Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        // What we rely on here is:
        // - bailout doesn't have any args.
        // - bailout doesn't use offset as we get it from DebuggingFlags at time of bailout.

        // Use prev debugger bailout kind as decoration, while keeping new kind as main.
        this->SetBailOutKind_NoAssert(kind);

        // Clear old (aux) info and set to the new bailOutInfo.
        this->ReplaceBailOutInfo(bailOutInfo);
        bailOutInfo->bailOutInstr = this;
        this->hasBailOutInfo = true;

        bailOutInstr = this;
    }
    else
    {
        switch (this->m_kind)
        {
        case InstrKindInstr:
            bailOutInstr = IR::BailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            break;
        case InstrKindProfiled:
            bailOutInstr = IR::ProfiledBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            bailOutInstr->AsProfiledInstr()->u = this->AsProfiledInstr()->u;
            break;
        case InstrKindBranch:
        {
            IR::BranchInstr * branchInstr = this->AsBranchInstr();
            Assert(!branchInstr->IsMultiBranch());
            IR::BranchBailOutInstr * branchBailOutInstr = IR::BranchBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            branchBailOutInstr->SetTarget(branchInstr->GetTarget());
            branchBailOutInstr->SetByteCodeReg(branchInstr->GetByteCodeReg());
            bailOutInstr = branchBailOutInstr;
            break;
        }
        default:
            AnalysisAssert(false);
        };

        this->m_next->m_prev = bailOutInstr;
        this->m_prev->m_next = bailOutInstr;
        bailOutInstr->m_next = this->m_next;
        bailOutInstr->m_prev = this->m_prev;

        this->TransferTo(bailOutInstr);

        this->Free();
    }

    if (useAuxBailOut)
    {
        // Move bail out kind from bailOutKind to auxBailOutKind and hide bailOutInfo as if this is not a bail out instr.
        bailOutInstr->SetAuxBailOutKind(kind);
        bailOutInstr->SetBailOutKind_NoAssert(IR::BailOutInvalid);
        bailOutInstr->hasBailOutInfo = false;
        bailOutInstr->hasAuxBailOut = true;
    }

    return bailOutInstr;
}